

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
           *this,VulkanMemoryAllocation *Object,Uint64 QueueMask)

{
  Uint32 UVar1;
  Char *pCVar2;
  Uint64 UVar3;
  Uint64 *pUVar4;
  char (*in_RCX) [19];
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  undefined1 local_e8 [8];
  string msg_3;
  CommandQueue *Queue;
  string msg_2;
  Uint32 QueueInd;
  DynamicStaleResourceWrapper Wrapper;
  RefCounterType NumReferences;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  Uint64 QueueMask_local;
  VulkanMemoryAllocation *Object_local;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  memory_order __b;
  
  msg.field_2._8_8_ = QueueMask;
  if (*(long *)(this + 0x1c48) == 0) {
    FormatString<char[99]>
              ((string *)local_58,
               (char (*) [99])
               "Command queues have been destroyed. Are you releasing an object from the render device destructor?"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [19])0x6b;
    DebugAssertionFailed
              (pCVar2,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6b);
    std::__cxx11::string::~string((string *)local_58);
  }
  UVar3 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ::GetCommandQueueMask
                    ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                      *)this);
  msg.field_2._8_8_ = UVar3 & msg.field_2._8_8_;
  if (msg.field_2._8_8_ == 0) {
    FormatString<char[57]>
              ((string *)&NumReferences,
               (char (*) [57])"At least one bit should be set in the command queue mask");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [19])0x6f;
    DebugAssertionFailed
              (pCVar2,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6f);
    std::__cxx11::string::~string((string *)&NumReferences);
  }
  if (msg.field_2._8_8_ != 0) {
    UVar1 = LinuxMisc::CountOneBits(msg.field_2._8_8_);
    Wrapper.m_pStaleResource = (StaleResourceBase *)(ulong)UVar1;
    DynamicStaleResourceWrapper::Create<VulkanUtilities::VulkanMemoryAllocation,void>
              ((DynamicStaleResourceWrapper *)&stack0xffffffffffffff68,Object,
               (RefCounterType)Wrapper.m_pStaleResource);
    for (; msg.field_2._8_8_ != 0;
        msg.field_2._8_8_ =
             (1L << ((byte)msg_2.field_2._12_4_ & 0x3f) ^ 0xffffffffffffffffU) & msg.field_2._8_8_)
    {
      msg_2.field_2._12_4_ = LinuxMisc::GetLSB(msg.field_2._8_8_);
      if (*(ulong *)(this + 0x1c40) <= (ulong)(uint)msg_2.field_2._12_4_) {
        FormatString<char[26],char[27]>
                  ((string *)&Queue,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc108a8
                   ,(char (*) [27])this);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"SafeReleaseDeviceObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x7a);
        std::__cxx11::string::~string((string *)&Queue);
      }
      msg_3.field_2._8_8_ = *(long *)(this + 0x1c48) + (ulong)(uint)msg_2.field_2._12_4_ * 0x168;
      this_00 = (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                (msg_3.field_2._8_8_ + 0x38);
      pUVar4 = (Uint64 *)(msg_3.field_2._8_8_ + 0x28);
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
                (this_00,(DynamicStaleResourceWrapper *)&stack0xffffffffffffff68,*pUVar4);
      in_RCX = (char (*) [19])(ulong)(uint)msg_2.field_2._12_4_;
      Wrapper.m_pStaleResource =
           (StaleResourceBase *)((long)&Wrapper.m_pStaleResource[-1]._vptr_StaleResourceBase + 7);
    }
    if (Wrapper.m_pStaleResource != (StaleResourceBase *)0x0) {
      FormatString<char[26],char[19]>
                ((string *)local_e8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"NumReferences == 0",in_RCX);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SafeReleaseDeviceObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                 ,0x82);
      std::__cxx11::string::~string((string *)local_e8);
    }
    DynamicStaleResourceWrapper::GiveUpOwnership
              ((DynamicStaleResourceWrapper *)&stack0xffffffffffffff68);
    DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper
              ((DynamicStaleResourceWrapper *)&stack0xffffffffffffff68);
  }
  return;
}

Assistant:

void SafeReleaseDeviceObject(ObjectType&& Object, Uint64 QueueMask)
    {
        VERIFY(m_CommandQueues != nullptr, "Command queues have been destroyed. Are you releasing an object from the render device destructor?");

        QueueMask &= GetCommandQueueMask();

        VERIFY(QueueMask != 0, "At least one bit should be set in the command queue mask");
        if (QueueMask == 0)
            return;

        DynamicStaleResourceWrapper::RefCounterType NumReferences = PlatformMisc::CountOneBits(QueueMask);

        auto Wrapper = DynamicStaleResourceWrapper::Create(std::move(Object), NumReferences);

        while (QueueMask != 0)
        {
            auto QueueInd = PlatformMisc::GetLSB(QueueMask);
            VERIFY_EXPR(QueueInd < m_CmdQueueCount);

            auto& Queue = m_CommandQueues[QueueInd];
            // Do not use std::move on wrapper!!!
            Queue.ReleaseQueue.SafeReleaseResource(Wrapper, Queue.NextCmdBufferNumber.load());
            QueueMask &= ~(Uint64{1} << Uint64{QueueInd});
            --NumReferences;
        }
        VERIFY_EXPR(NumReferences == 0);

        Wrapper.GiveUpOwnership();
    }